

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O2

int slow_bitmap_full(unsigned_long *bitmap,long bits)

{
  unsigned_long *puVar1;
  ulong uVar2;
  
  uVar2 = 0;
  while ((ulong)bits >> 6 != uVar2) {
    puVar1 = bitmap + uVar2;
    uVar2 = uVar2 + 1;
    if (*puVar1 != 0xffffffffffffffff) {
      return 0;
    }
  }
  if (((bits & 0x3fU) != 0) && (~bitmap[(ulong)bits >> 6] << (-(char)bits & 0x3fU) != 0)) {
    return 0;
  }
  return 1;
}

Assistant:

int slow_bitmap_full(const unsigned long *bitmap, long bits)
{
    long k, lim = bits/BITS_PER_LONG;

    for (k = 0; k < lim; ++k) {
        if (~bitmap[k]) {
            return 0;
        }
    }

    if (bits % BITS_PER_LONG) {
        if (~bitmap[k] & BITMAP_LAST_WORD_MASK(bits)) {
            return 0;
        }
    }

    return 1;
}